

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::parse_resource_table
               (bounded_buffer *sectionData,uint32_t o,uint32_t virtaddr,uint32_t depth,
               resource_dir_entry *dirent,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  bool bVar1;
  resource *prVar2;
  uint32_t in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  resource *in_R8;
  resource_dir_entry *in_R9;
  uint32_t start;
  resource rsrc;
  resource_dat_entry rdat;
  resource_dir_entry *rde;
  uint32_t i;
  resource_dir_table rdt;
  resource *in_stack_fffffffffffffae0;
  value_type *in_stack_fffffffffffffae8;
  value_type *in_stack_fffffffffffffaf0;
  string *this;
  bounded_buffer *in_stack_fffffffffffffb08;
  string *in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  uint32_t uVar3;
  bounded_buffer *in_stack_fffffffffffffb48;
  uint32_t *in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  bounded_buffer *in_stack_fffffffffffffb88;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  uint local_3c0;
  undefined4 local_3bc;
  value_type *local_3b8;
  string local_3b0 [32];
  string local_390 [16];
  _func_ios_base_ptr_ios_base_ptr *in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc8c;
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  uint local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  resource *local_1e0;
  uint local_1d4;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [48];
  string local_80 [32];
  string local_60 [40];
  undefined4 in_stack_ffffffffffffffc8;
  ushort in_stack_ffffffffffffffcc;
  ushort in_stack_ffffffffffffffce;
  uint32_t in_stack_ffffffffffffffe0;
  byte local_1;
  
  if (in_RDI == 0) {
    local_1 = 0;
  }
  else {
    bVar1 = readDword(in_stack_fffffffffffffb88,(uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20)
                      ,in_stack_fffffffffffffb78);
    if (bVar1) {
      bVar1 = readDword(in_stack_fffffffffffffb88,
                        (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                        in_stack_fffffffffffffb78);
      if (bVar1) {
        bVar1 = readWord(in_stack_fffffffffffffb88,
                         (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                         (uint16_t *)in_stack_fffffffffffffb78);
        if (bVar1) {
          bVar1 = readWord(in_stack_fffffffffffffb88,
                           (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                           (uint16_t *)in_stack_fffffffffffffb78);
          if (bVar1) {
            bVar1 = readWord(in_stack_fffffffffffffb88,
                             (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                             (uint16_t *)in_stack_fffffffffffffb78);
            if (bVar1) {
              bVar1 = readWord(in_stack_fffffffffffffb88,
                               (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                               (uint16_t *)in_stack_fffffffffffffb78);
              if (bVar1) {
                in_ESI = in_ESI + 0x10;
                if ((in_stack_ffffffffffffffcc == 0) && (in_stack_ffffffffffffffce == 0)) {
                  local_1 = 1;
                }
                else {
                  for (local_1d4 = 0;
                      local_1d4 < (uint)in_stack_ffffffffffffffcc + (uint)in_stack_ffffffffffffffce;
                      local_1d4 = local_1d4 + 1) {
                    local_1e0 = in_R8;
                    if (in_R8 == (resource *)0x0) {
                      prVar2 = (resource *)operator_new(0x78);
                      resource_dir_entry::resource_dir_entry
                                ((resource_dir_entry *)in_stack_fffffffffffffae0);
                      local_1e0 = prVar2;
                    }
                    bVar1 = readDword(in_stack_fffffffffffffb88,
                                      (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                      in_stack_fffffffffffffb78);
                    if (!bVar1) {
                      err = 6;
                      std::__cxx11::string::assign(err_loc_abi_cxx11_);
                      to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
                      std::operator+((char *)in_stack_fffffffffffffae8,
                                     &in_stack_fffffffffffffae0->type_str);
                      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_200);
                      std::__cxx11::string::~string(local_200);
                      std::__cxx11::string::~string(local_220);
                      if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                        prVar2 = local_1e0;
                        resource_dir_entry::~resource_dir_entry
                                  ((resource_dir_entry *)in_stack_fffffffffffffae0);
                        operator_delete(prVar2,0x78);
                      }
                      local_1 = 0;
                      goto LAB_0013b8a2;
                    }
                    bVar1 = readDword(in_stack_fffffffffffffb88,
                                      (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                      in_stack_fffffffffffffb78);
                    if (!bVar1) {
                      err = 6;
                      std::__cxx11::string::assign(err_loc_abi_cxx11_);
                      to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
                      std::operator+((char *)in_stack_fffffffffffffae8,
                                     &in_stack_fffffffffffffae0->type_str);
                      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_240);
                      std::__cxx11::string::~string(local_240);
                      std::__cxx11::string::~string(local_260);
                      prVar2 = local_1e0;
                      if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                        resource_dir_entry::~resource_dir_entry
                                  ((resource_dir_entry *)in_stack_fffffffffffffae0);
                        operator_delete(prVar2,0x78);
                      }
                      local_1 = 0;
                      goto LAB_0013b8a2;
                    }
                    in_ESI = in_ESI + 8;
                    uVar3 = (uint32_t)((ulong)in_stack_fffffffffffffb40 >> 0x20);
                    if (in_ECX == 0) {
                      *(undefined4 *)&(local_1e0->type_str)._M_string_length =
                           *(undefined4 *)&local_1e0->type_str;
                      if ((local_1d4 < in_stack_ffffffffffffffcc) &&
                         (bVar1 = parse_resource_id(in_stack_fffffffffffffb48,uVar3,
                                                    in_stack_fffffffffffffb38), prVar2 = local_1e0,
                         !bVar1)) {
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                    }
                    else if (in_ECX == 1) {
                      *(undefined4 *)((long)&(local_1e0->type_str)._M_string_length + 4) =
                           *(undefined4 *)&local_1e0->type_str;
                      if ((local_1d4 < in_stack_ffffffffffffffcc) &&
                         (bVar1 = parse_resource_id(in_stack_fffffffffffffb48,uVar3,
                                                    in_stack_fffffffffffffb38), prVar2 = local_1e0,
                         !bVar1)) {
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                    }
                    else {
                      if (in_ECX != 2) {
                        err = 4;
                        std::__cxx11::string::assign(err_loc_abi_cxx11_);
                        to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80)
                        ;
                        std::operator+((char *)in_stack_fffffffffffffae8,
                                       &in_stack_fffffffffffffae0->type_str);
                        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_280);
                        std::__cxx11::string::~string(local_280);
                        std::__cxx11::string::~string(local_2a0);
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                      *(undefined4 *)&(local_1e0->type_str).field_2 =
                           *(undefined4 *)&local_1e0->type_str;
                      if ((local_1d4 < in_stack_ffffffffffffffcc) &&
                         (bVar1 = parse_resource_id(in_stack_fffffffffffffb48,uVar3,
                                                    in_stack_fffffffffffffb38), prVar2 = local_1e0,
                         !bVar1)) {
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                    }
                    if ((*(uint *)&(local_1e0->type_str).field_0x4 & 0x80000000) == 0) {
                      bVar1 = readDword(in_stack_fffffffffffffb88,
                                        (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                        in_stack_fffffffffffffb78);
                      if (!bVar1) {
                        err = 6;
                        std::__cxx11::string::assign(err_loc_abi_cxx11_);
                        to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80)
                        ;
                        std::operator+((char *)in_stack_fffffffffffffae8,
                                       &in_stack_fffffffffffffae0->type_str);
                        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_2d0);
                        std::__cxx11::string::~string(local_2d0);
                        std::__cxx11::string::~string(local_2f0);
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          prVar2 = local_1e0;
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                      bVar1 = readDword(in_stack_fffffffffffffb88,
                                        (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                        in_stack_fffffffffffffb78);
                      if (!bVar1) {
                        err = 6;
                        std::__cxx11::string::assign(err_loc_abi_cxx11_);
                        to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80)
                        ;
                        std::operator+((char *)in_stack_fffffffffffffae8,
                                       &in_stack_fffffffffffffae0->type_str);
                        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_310);
                        std::__cxx11::string::~string(local_310);
                        std::__cxx11::string::~string(local_330);
                        prVar2 = local_1e0;
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                      bVar1 = readDword(in_stack_fffffffffffffb88,
                                        (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                        in_stack_fffffffffffffb78);
                      if (!bVar1) {
                        err = 6;
                        std::__cxx11::string::assign(err_loc_abi_cxx11_);
                        to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80)
                        ;
                        std::operator+((char *)in_stack_fffffffffffffae8,
                                       &in_stack_fffffffffffffae0->type_str);
                        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_350);
                        std::__cxx11::string::~string(local_350);
                        std::__cxx11::string::~string(local_370);
                        prVar2 = local_1e0;
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                      bVar1 = readDword(in_stack_fffffffffffffb88,
                                        (uint32_t)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                        in_stack_fffffffffffffb78);
                      if (!bVar1) {
                        err = 6;
                        std::__cxx11::string::assign(err_loc_abi_cxx11_);
                        to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80)
                        ;
                        std::operator+((char *)in_stack_fffffffffffffae8,
                                       &in_stack_fffffffffffffae0->type_str);
                        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_390);
                        std::__cxx11::string::~string(local_390);
                        std::__cxx11::string::~string(local_3b0);
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          prVar2 = local_1e0;
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                      this = local_430;
                      resource::resource(in_stack_fffffffffffffae0);
                      std::__cxx11::string::operator=
                                (this,(string *)((local_1e0->type_str).field_2._M_local_buf + 8));
                      std::__cxx11::string::operator=
                                (local_410,
                                 (string *)((local_1e0->name_str).field_2._M_local_buf + 8));
                      std::__cxx11::string::operator=
                                (local_3f0,
                                 (string *)((local_1e0->lang_str).field_2._M_local_buf + 8));
                      local_3d0 = (undefined4)(local_1e0->type_str)._M_string_length;
                      local_3cc = *(undefined4 *)((long)&(local_1e0->type_str)._M_string_length + 4)
                      ;
                      local_3c8 = *(undefined4 *)&(local_1e0->type_str).field_2;
                      local_3c4 = local_2a8;
                      local_3c0 = local_2b0;
                      local_3bc = local_2ac;
                      uVar3 = (uint32_t)((ulong)this >> 0x20);
                      if (local_2b0 < local_2b0 - in_EDX) {
                        local_3b8 = (value_type *)
                                    splitBuffer(in_stack_fffffffffffffb08,uVar3,(uint32_t)this);
                      }
                      else {
                        in_stack_fffffffffffffaf0 =
                             (value_type *)
                             splitBuffer(in_stack_fffffffffffffb08,uVar3,(uint32_t)this);
                        local_3b8 = in_stack_fffffffffffffaf0;
                        if (in_stack_fffffffffffffaf0 == (value_type *)0x0) {
                          in_stack_fffffffffffffae8 =
                               (value_type *)
                               splitBuffer(in_stack_fffffffffffffb08,(uint32_t)((ulong)this >> 0x20)
                                           ,(uint32_t)this);
                          local_3b8 = in_stack_fffffffffffffae8;
                        }
                      }
                      if (local_3b8 == (value_type *)0x0) {
                        if ((in_R8 == (resource *)0x0) &&
                           (in_stack_fffffffffffffae0 = local_1e0, local_1e0 != (resource *)0x0)) {
                          resource_dir_entry::~resource_dir_entry((resource_dir_entry *)local_1e0);
                          operator_delete(in_stack_fffffffffffffae0,0x78);
                        }
                        local_1 = 0;
                        bVar1 = true;
                      }
                      else {
                        std::vector<peparse::resource,_std::allocator<peparse::resource>_>::
                        push_back((vector<peparse::resource,_std::allocator<peparse::resource>_> *)
                                  in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
                        bVar1 = false;
                      }
                      resource::~resource(in_stack_fffffffffffffae0);
                      if (bVar1) goto LAB_0013b8a2;
                    }
                    else {
                      bVar1 = parse_resource_table
                                        ((bounded_buffer *)CONCAT44(in_ESI,in_EDX),in_ECX,
                                         in_stack_ffffffffffffffe0,(uint32_t)((ulong)in_R8 >> 0x20),
                                         in_R9,(vector<peparse::resource,_std::allocator<peparse::resource>_>
                                                *)CONCAT26(in_stack_ffffffffffffffce,
                                                           CONCAT24(in_stack_ffffffffffffffcc,
                                                                    in_stack_ffffffffffffffc8)));
                      if (!bVar1) {
                        if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                          prVar2 = local_1e0;
                          resource_dir_entry::~resource_dir_entry
                                    ((resource_dir_entry *)in_stack_fffffffffffffae0);
                          operator_delete(prVar2,0x78);
                        }
                        local_1 = 0;
                        goto LAB_0013b8a2;
                      }
                    }
                    if (in_ECX == 0) {
                      std::__cxx11::string::clear();
                    }
                    else if (in_ECX == 1) {
                      std::__cxx11::string::clear();
                    }
                    else if (in_ECX == 2) {
                      std::__cxx11::string::clear();
                    }
                    prVar2 = local_1e0;
                    if ((in_R8 == (resource *)0x0) && (local_1e0 != (resource *)0x0)) {
                      resource_dir_entry::~resource_dir_entry
                                ((resource_dir_entry *)in_stack_fffffffffffffae0);
                      operator_delete(prVar2,0x78);
                    }
                  }
                  local_1 = 1;
                }
              }
              else {
                err = 6;
                std::__cxx11::string::assign(err_loc_abi_cxx11_);
                to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
                std::operator+((char *)in_stack_fffffffffffffae8,
                               &in_stack_fffffffffffffae0->type_str);
                std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_1b0);
                std::__cxx11::string::~string(local_1b0);
                std::__cxx11::string::~string(local_1d0);
                local_1 = 0;
              }
            }
            else {
              err = 6;
              std::__cxx11::string::assign(err_loc_abi_cxx11_);
              to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
              std::operator+((char *)in_stack_fffffffffffffae8,&in_stack_fffffffffffffae0->type_str)
              ;
              std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_170);
              std::__cxx11::string::~string(local_170);
              std::__cxx11::string::~string(local_190);
              local_1 = 0;
            }
          }
          else {
            err = 6;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
            std::operator+((char *)in_stack_fffffffffffffae8,&in_stack_fffffffffffffae0->type_str);
            std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_130);
            std::__cxx11::string::~string(local_130);
            std::__cxx11::string::~string(local_150);
            local_1 = 0;
          }
        }
        else {
          err = 6;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
          std::operator+((char *)in_stack_fffffffffffffae8,&in_stack_fffffffffffffae0->type_str);
          std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_f0);
          std::__cxx11::string::~string(local_f0);
          std::__cxx11::string::~string(local_110);
          local_1 = 0;
        }
      }
      else {
        err = 6;
        std::__cxx11::string::assign(err_loc_abi_cxx11_);
        to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
        std::operator+((char *)in_stack_fffffffffffffae8,&in_stack_fffffffffffffae0->type_str);
        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        local_1 = 0;
      }
    }
    else {
      err = 6;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80);
      std::operator+((char *)in_stack_fffffffffffffae8,&in_stack_fffffffffffffae0->type_str);
      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_60);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      local_1 = 0;
    }
  }
LAB_0013b8a2:
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_resource_table(bounded_buffer *sectionData,
                          std::uint32_t o,
                          std::uint32_t virtaddr,
                          std::uint32_t depth,
                          resource_dir_entry *dirent,
                          std::vector<resource> &rsrcs) {
  resource_dir_table rdt;

  if (sectionData == nullptr) {
    return false;
  }

  READ_DWORD(sectionData, o, rdt, Characteristics);
  READ_DWORD(sectionData, o, rdt, TimeDateStamp);
  READ_WORD(sectionData, o, rdt, MajorVersion);
  READ_WORD(sectionData, o, rdt, MinorVersion);
  READ_WORD(sectionData, o, rdt, NameEntries);
  READ_WORD(sectionData, o, rdt, IDEntries);

  o += sizeof(resource_dir_table);

  if (rdt.NameEntries == 0u && rdt.IDEntries == 0u) {
    return true; // This is not a hard error. It does happen.
  }

  for (std::uint32_t i = 0;
       i < static_cast<std::uint32_t>(rdt.NameEntries + rdt.IDEntries);
       i++) {
    resource_dir_entry *rde = dirent;
    if (dirent == nullptr) {
      rde = new resource_dir_entry;
    }

    if (!readDword(sectionData, o + offsetof(__typeof__(*rde), ID), rde->ID)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    if (!readDword(
            sectionData, o + offsetof(__typeof__(*rde), RVA), rde->RVA)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    o += sizeof(resource_dir_entry_sz);

    if (depth == 0) {
      rde->type = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->type_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 1) {
      rde->name = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->name_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 2) {
      rde->lang = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->lang_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else {
      /* .rsrc can accommodate up to 2**31 levels, but Windows only uses 3 by
       * convention. As such, any depth above 3 indicates potentially unchecked
       * recursion. See:
       * https://docs.microsoft.com/en-us/windows/desktop/debug/pe-format#the-rsrc-section
       */

      PE_ERR(PEERR_RESC);
      return false;
    }

    // High bit 0 = RVA to RDT.
    // High bit 1 = RVA to RDE.
    if (rde->RVA & 0x80000000) {
      if (!parse_resource_table(sectionData,
                                rde->RVA & 0x0FFFFFFF,
                                virtaddr,
                                depth + 1,
                                rde,
                                rsrcs)) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }
    } else {
      resource_dat_entry rdat;

      /*
       * This one is using rde->RVA as an offset.
       *
       * This is because we don't want to set o because we have to keep the
       * original value when we are done parsing this resource data entry.
       * We could store the original o value and reset it when we are done,
       * but meh.
       */

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), RVA),
                     rdat.RVA)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), size),
                     rdat.size)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), codepage),
                     rdat.codepage)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), reserved),
                     rdat.reserved)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      resource rsrc;
      rsrc.type_str = rde->type_str;
      rsrc.name_str = rde->name_str;
      rsrc.lang_str = rde->lang_str;
      rsrc.type = rde->type;
      rsrc.name = rde->name;
      rsrc.lang = rde->lang;
      rsrc.codepage = rdat.codepage;
      rsrc.RVA = rdat.RVA;
      rsrc.size = rdat.size;

      // The start address is (RVA - section virtual address).
      uint32_t start = rdat.RVA - virtaddr;
      /*
       * Some binaries (particularly packed) will have invalid addresses here.
       * If those happen, return a zero length buffer.
       * If the start is valid, try to get the data and if that fails return
       * a zero length buffer.
       */
      if (start > rdat.RVA) {
        rsrc.buf = splitBuffer(sectionData, 0, 0);
      } else {
        rsrc.buf = splitBuffer(sectionData, start, start + rdat.size);
        if (rsrc.buf == nullptr) {
          rsrc.buf = splitBuffer(sectionData, 0, 0);
        }
      }

      /* If we can't get even a zero length buffer, something is very wrong. */
      if (rsrc.buf == nullptr) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      rsrcs.push_back(rsrc);
    }

    if (depth == 0) {
      rde->type_str.clear();
    } else if (depth == 1) {
      rde->name_str.clear();
    } else if (depth == 2) {
      rde->lang_str.clear();
    }

    if (dirent == nullptr) {
      delete rde;
    }
  }

  return true;
}